

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effective_info.c
# Opt level: O2

double inform_effective_info(double *tpm,double *inter,size_t n,inform_error *err)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  inform_error iVar4;
  size_t i;
  void *__ptr;
  size_t sVar5;
  double *pdVar6;
  size_t sVar7;
  size_t i_1;
  double *sf;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  
  if (tpm == (double *)0x0) {
LAB_00133b20:
    if (err == (inform_error *)0x0) {
      return NAN;
    }
    iVar4 = INFORM_ETPM;
  }
  else if (n == 0) {
    if (err == (inform_error *)0x0) {
      return NAN;
    }
    iVar4 = INFORM_ESIZE;
  }
  else {
    pdVar1 = tpm + n * n;
    for (pdVar6 = tpm; pdVar6 < pdVar1; pdVar6 = pdVar6 + n) {
      dVar8 = sum_row(pdVar6,n);
      if ((NAN(dVar8)) || (1e-06 < ABS(dVar8 + -1.0))) goto LAB_00133b20;
    }
    if (inter == (double *)0x0) {
LAB_00133b8b:
      __ptr = calloc(n * 2,8);
      if (__ptr != (void *)0x0) {
        if (inter == (double *)0x0) {
          auVar10._8_4_ = (int)(n >> 0x20);
          auVar10._0_8_ = n;
          auVar10._12_4_ = 0x45300000;
          inter = (double *)((long)__ptr + n * 8);
          for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
            inter[sVar5] = 1.0 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0));
          }
        }
        pdVar6 = tpm;
        for (sVar5 = 0; sVar5 != n; sVar5 = sVar5 + 1) {
          for (sVar7 = 0; n != sVar7; sVar7 = sVar7 + 1) {
            *(double *)((long)__ptr + sVar7 * 8) =
                 inter[sVar5] * pdVar6[sVar7] + *(double *)((long)__ptr + sVar7 * 8);
          }
          pdVar6 = pdVar6 + n;
        }
        dVar8 = 0.0;
        for (; tpm != pdVar1; tpm = tpm + n) {
          dVar2 = *inter;
          dVar11 = 0.0;
          for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
            dVar3 = tpm[sVar5];
            if ((dVar3 != 0.0) || (NAN(dVar3))) {
              dVar9 = log2(dVar3 / *(double *)((long)__ptr + sVar5 * 8));
              dVar11 = dVar11 + dVar9 * dVar3;
            }
          }
          dVar8 = dVar8 + dVar2 * dVar11;
          inter = inter + 1;
        }
        free(__ptr);
        return dVar8;
      }
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
        return NAN;
      }
      return NAN;
    }
    dVar8 = sum_row(inter,n);
    if (NAN(dVar8)) {
      if (err == (inform_error *)0x0) {
        return NAN;
      }
      iVar4 = INFORM_EDIST;
    }
    else {
      if (ABS(dVar8 + -1.0) <= 1e-06) goto LAB_00133b8b;
      if (err == (inform_error *)0x0) {
        return NAN;
      }
      iVar4 = INFORM_EDIST;
    }
  }
  *err = iVar4;
  return NAN;
}

Assistant:

double inform_effective_info(double const *tpm, double const *inter, size_t n,
    inform_error *err)
{
    if (check_arguments(tpm, inter, n, err))
    {
        return NAN;
    }

    // allocate enough memory for the ID and ED distributions
    double *data = calloc(2 * n, sizeof(double));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    // set the ID and ED pointers to pointer the right places
    double *ed = data;
    double const *id;
    if (inter != NULL)
    {
        id = inter;
    }
    else
    {
        // make the ID distribution uniform
        double const k = 1.0 / n;
        for (size_t i = 0; i < n; ++i) data[i + n] = k;
        id = (double const *) data + n;
    }

    // compute the ED given the ID and TPM
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < n; ++j)
        {
            ed[j] += id[i] * tpm[j + i*n];
        }
    }

    // and comput the effective information
    double ei = 0.0;
    for (double const *sf = tpm; sf != tpm + n*n; sf += n, ++id)
    {
        ei += (*id) * kldivergence(sf, ed, n);
    }

    free(data);

    return ei;
}